

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O3

void build_alloc(void *base,guard *guard,size_t size)

{
  memdesc *pmVar1;
  memdesc **ppmVar2;
  memdesc_node *pmVar3;
  unsigned_long uVar4;
  int iVar5;
  memdesc *pmVar6;
  ulong uVar7;
  char *pcVar8;
  char *msg;
  undefined8 local_38;
  
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&descriptors_lock);
  pmVar6 = hdbg.descriptors.tqh_first;
  if (iVar5 == 0) {
    if (hdbg.descriptors.tqh_first == (memdesc *)0x0) {
      iVar5 = pthread_mutex_unlock((pthread_mutex_t *)&descriptors_lock);
      if (iVar5 == 0) {
        pmVar6 = (memdesc *)
                 (*real_malloc)(CONCAT44(hdbg.maxframes._4_4_,(int)hdbg.maxframes) * 8 + 0x30);
        goto LAB_001015ae;
      }
    }
    else {
      pmVar1 = ((hdbg.descriptors.tqh_first)->node).tqe_next;
      ppmVar2 = ((hdbg.descriptors.tqh_first)->node).tqe_prev;
      pmVar3 = &pmVar1->node;
      if (pmVar1 == (memdesc *)0x0) {
        pmVar3 = (memdesc_node *)&hdbg.descriptors;
      }
      pmVar3->tqe_prev = ppmVar2;
      *ppmVar2 = pmVar1;
      iVar5 = pthread_mutex_unlock((pthread_mutex_t *)&descriptors_lock);
      if (iVar5 == 0) {
LAB_001015ae:
        guard->desc = pmVar6;
        pmVar6->data = guard;
        pmVar6->len = size;
        pmVar6->base = base;
        *(undefined4 *)((long)&guard[1].desc + size) = 0xa5a5a5a5;
        pmVar6->data->state = mem_allocated;
        getstacktrace(pmVar6->stack,(int)hdbg.maxframes);
        iVar5 = pthread_mutex_lock((pthread_mutex_t *)&heap_lock);
        if (iVar5 != 0) goto LAB_001016a0;
        uVar4 = hdbg.serial + 1;
        pmVar6->serial = hdbg.serial;
        hdbg.serial = uVar4;
        hdbg.stats.alloc_total = hdbg.stats.alloc_total + size;
        if ((hdbg.stats.maxmem < hdbg.stats.alloc_total) &&
           (hdbg.stats.maxmem = hdbg.stats.alloc_total,
           hdbg.alloc_limit < hdbg.stats.alloc_total && hdbg.alloc_limit != 0)) {
          die("exceeded set memory limit");
        }
        (pmVar6->node).tqe_next = hdbg.heap.tqh_first;
        if (hdbg.heap.tqh_first == (memdesc *)0x0) {
          hdbg.heap.tqh_first = (memdesc *)&hdbg;
        }
        ((memdesc_node *)&((hdbg_info *)hdbg.heap.tqh_first)->heap)->tqe_prev = (memdesc **)pmVar6;
        hdbg.heap.tqh_first = pmVar6;
        (pmVar6->node).tqe_prev = (memdesc **)&hdbg;
        iVar5 = pthread_mutex_unlock((pthread_mutex_t *)&heap_lock);
        if (iVar5 == 0) {
          local_38 = 0xbaadf00d;
          if ((0 < (int)(uint)size) && (hdbg.doFill != 0)) {
            uVar7 = 0;
            do {
              *(undefined1 *)((long)&guard[1].desc + uVar7) =
                   *(undefined1 *)((long)&local_38 + (ulong)((uint)uVar7 & 3));
              uVar7 = uVar7 + 1;
            } while (((uint)size & 0x7fffffff) != uVar7);
          }
          return;
        }
      }
    }
    pcVar8 = strerror(iVar5);
    msg = "unlock failed: %s";
  }
  else {
LAB_001016a0:
    pcVar8 = strerror(iVar5);
    msg = "lock failed: %s";
  }
  die(msg,pcVar8);
}

Assistant:

static inline void build_alloc(void *base, struct guard *guard, size_t size) {
    struct memdesc *desc;
    LOCK(&descriptors_lock);
    if (TAILQ_EMPTY(&hdbg.descriptors)) {
        UNLOCK(&descriptors_lock);
        desc = real_malloc(sizeof (struct memdesc) +
              sizeof (void *) * (hdbg.maxframes - 1));
    } else {
        desc = TAILQ_FIRST(&hdbg.descriptors);
        TAILQ_REMOVE(&hdbg.descriptors, desc, node);
        UNLOCK(&descriptors_lock);
    }
    guard->desc = desc;
    desc->data = guard;
    desc->len = size;
    desc->base = base;
    set_state(desc, mem_allocated);
    getstacktrace(desc->stack, hdbg.maxframes);

    LOCK(&heap_lock);
    desc->serial = hdbg.serial++;
    hdbg.stats.alloc_total += size;
    if (hdbg.stats.alloc_total > hdbg.stats.maxmem) {
        hdbg.stats.maxmem = hdbg.stats.alloc_total;
        if (hdbg.alloc_limit && hdbg.stats.alloc_total > hdbg.alloc_limit)
           die("exceeded set memory limit");
        hdbg.stats.maxmem = hdbg.stats.alloc_total;
    }
    TAILQ_INSERT_HEAD(&hdbg.heap, desc, node);
    UNLOCK(&heap_lock);
    fill(guard + 1, size, 0xbaadf00d);
}